

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::MultiThreadedObjectTest::pullObjectsFromShared
          (MultiThreadedObjectTest *this,TestThread *thread,int pbufferCount,int pixmapCount,
          int windowCount,int contextCount)

{
  pointer ppvVar1;
  iterator iVar2;
  iterator __position;
  iterator __position_00;
  void *pvVar3;
  deUint32 dVar4;
  deRandom *rnd;
  pointer ppVar5;
  pointer ppVar6;
  pointer ppVar7;
  pointer ppVar8;
  vector<std::pair<eglu::NativeWindow*,void*>,std::allocator<std::pair<eglu::NativeWindow*,void*>>>
  *this_00;
  void **ppvVar9;
  pair<eglu::NativePixmap_*,_void_*> *__args;
  long lVar10;
  ulong uVar11;
  pair<eglu::NativeWindow_*,_void_*> *__args_00;
  vector<std::pair<eglu::NativePixmap*,void*>,std::allocator<std::pair<eglu::NativePixmap*,void*>>>
  *this_01;
  long lVar12;
  pointer ppvVar13;
  vector<void*,std::allocator<void*>> *this_02;
  pointer ppvVar14;
  pointer ppVar15;
  pointer ppVar16;
  vector<void*,std::allocator<void*>> *this_03;
  pointer ppVar17;
  int iVar18;
  pointer ppVar19;
  
  iVar18 = thread->m_id;
  this_02 = (vector<void*,std::allocator<void*>> *)&this->m_contexts0;
  if (iVar18 != 0) {
    this_02 = (vector<void*,std::allocator<void*>> *)&this->m_contexts1;
  }
  this_01 = (vector<std::pair<eglu::NativePixmap*,void*>,std::allocator<std::pair<eglu::NativePixmap*,void*>>>
             *)&this->m_nativePixmaps1;
  if (iVar18 == 0) {
    this_01 = (vector<std::pair<eglu::NativePixmap*,void*>,std::allocator<std::pair<eglu::NativePixmap*,void*>>>
               *)&this->m_nativePixmaps0;
  }
  this_00 = (vector<std::pair<eglu::NativeWindow*,void*>,std::allocator<std::pair<eglu::NativeWindow*,void*>>>
             *)&this->m_nativeWindows1;
  if (iVar18 == 0) {
    this_00 = (vector<std::pair<eglu::NativeWindow*,void*>,std::allocator<std::pair<eglu::NativeWindow*,void*>>>
               *)&this->m_nativeWindows0;
  }
  this_03 = (vector<void*,std::allocator<void*>> *)&this->m_pbuffers1;
  if (iVar18 == 0) {
    this_03 = (vector<void*,std::allocator<void*>> *)&this->m_pbuffers0;
  }
  rnd = &(&this->m_rnd0)[iVar18 != 0].m_rnd;
  if (0 < pbufferCount) {
    ppvVar14 = (this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    do {
      ppvVar1 = (this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                .super__Vector_impl_data._M_start;
      dVar4 = deRandom_getUint32(rnd);
      lVar12 = (long)(int)((ulong)dVar4 %
                          ((ulong)((long)ppvVar14 - (long)ppvVar1) >> 3 & 0xffffffff));
      ppvVar9 = (this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                .super__Vector_impl_data._M_start + lVar12;
      iVar2._M_current = *(void ***)(this_03 + 8);
      if (iVar2._M_current == *(void ***)(this_03 + 0x10)) {
        std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
                  (this_03,iVar2,ppvVar9);
      }
      else {
        *iVar2._M_current = *ppvVar9;
        *(long *)(this_03 + 8) = *(long *)(this_03 + 8) + 8;
      }
      ppvVar1 = (this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                .super__Vector_impl_data._M_start;
      ppvVar14 = (this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      ppvVar13 = ppvVar1 + lVar12 + 1;
      if (ppvVar13 != ppvVar14) {
        memmove(ppvVar1 + lVar12,ppvVar13,(long)ppvVar14 - (long)ppvVar13);
        ppvVar14 = (this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      }
      ppvVar14 = ppvVar14 + -1;
      (this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppvVar14;
      pbufferCount = pbufferCount + -1;
    } while (pbufferCount != 0);
  }
  if (0 < pixmapCount) {
    ppVar5 = (this->m_sharedNativePixmaps).
             super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar15 = (this->m_sharedNativePixmaps).
              super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    iVar18 = 0;
    do {
      dVar4 = deRandom_getUint32(rnd);
      lVar12 = (long)(int)((ulong)dVar4 % ((ulong)((long)ppVar15 - (long)ppVar5) >> 4 & 0xffffffff))
      ;
      __args = (this->m_sharedNativePixmaps).
               super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar12;
      __position._M_current = *(pair<eglu::NativePixmap_*,_void_*> **)(this_01 + 8);
      if (__position._M_current == *(pair<eglu::NativePixmap_*,_void_*> **)(this_01 + 0x10)) {
        std::
        vector<std::pair<eglu::NativePixmap*,void*>,std::allocator<std::pair<eglu::NativePixmap*,void*>>>
        ::_M_realloc_insert<std::pair<eglu::NativePixmap*,void*>const&>(this_01,__position,__args);
      }
      else {
        pvVar3 = __args->second;
        (__position._M_current)->first = __args->first;
        (__position._M_current)->second = pvVar3;
        *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 0x10;
      }
      ppVar5 = (this->m_sharedNativePixmaps).
               super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar15 = (this->m_sharedNativePixmaps).
                super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppVar7 = ppVar5 + lVar12 + 1;
      if ((ppVar7 != ppVar15) && (lVar10 = (long)ppVar15 - (long)ppVar7 >> 4, 0 < lVar10)) {
        ppVar17 = ppVar5 + lVar12;
        uVar11 = lVar10 + 1;
        do {
          ppVar17->first = ppVar7->first;
          ppVar17->second = ppVar7->second;
          ppVar7 = ppVar7 + 1;
          ppVar17 = ppVar17 + 1;
          uVar11 = uVar11 - 1;
        } while (1 < uVar11);
      }
      ppVar15 = ppVar15 + -1;
      (this->m_sharedNativePixmaps).
      super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar15;
      iVar18 = iVar18 + 1;
    } while (iVar18 != pixmapCount);
  }
  if (0 < windowCount) {
    ppVar6 = (this->m_sharedNativeWindows).
             super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar19 = (this->m_sharedNativeWindows).
              super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    iVar18 = 0;
    do {
      dVar4 = deRandom_getUint32(rnd);
      lVar12 = (long)(int)((ulong)dVar4 % ((ulong)((long)ppVar19 - (long)ppVar6) >> 4 & 0xffffffff))
      ;
      __args_00 = (this->m_sharedNativeWindows).
                  super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar12;
      __position_00._M_current = *(pair<eglu::NativeWindow_*,_void_*> **)(this_00 + 8);
      if (__position_00._M_current == *(pair<eglu::NativeWindow_*,_void_*> **)(this_00 + 0x10)) {
        std::
        vector<std::pair<eglu::NativeWindow*,void*>,std::allocator<std::pair<eglu::NativeWindow*,void*>>>
        ::_M_realloc_insert<std::pair<eglu::NativeWindow*,void*>const&>
                  (this_00,__position_00,__args_00);
      }
      else {
        pvVar3 = __args_00->second;
        (__position_00._M_current)->first = __args_00->first;
        (__position_00._M_current)->second = pvVar3;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
      }
      ppVar6 = (this->m_sharedNativeWindows).
               super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar19 = (this->m_sharedNativeWindows).
                super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppVar8 = ppVar6 + lVar12 + 1;
      if ((ppVar8 != ppVar19) && (lVar10 = (long)ppVar19 - (long)ppVar8 >> 4, 0 < lVar10)) {
        ppVar16 = ppVar6 + lVar12;
        uVar11 = lVar10 + 1;
        do {
          ppVar16->first = ppVar8->first;
          ppVar16->second = ppVar8->second;
          ppVar8 = ppVar8 + 1;
          ppVar16 = ppVar16 + 1;
          uVar11 = uVar11 - 1;
        } while (1 < uVar11);
      }
      ppVar19 = ppVar19 + -1;
      (this->m_sharedNativeWindows).
      super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar19;
      iVar18 = iVar18 + 1;
    } while (iVar18 != windowCount);
  }
  if (0 < contextCount) {
    ppvVar14 = (this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    do {
      ppvVar1 = (this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                .super__Vector_impl_data._M_start;
      dVar4 = deRandom_getUint32(rnd);
      lVar12 = (long)(int)((ulong)dVar4 %
                          ((ulong)((long)ppvVar14 - (long)ppvVar1) >> 3 & 0xffffffff));
      ppvVar9 = (this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                .super__Vector_impl_data._M_start + lVar12;
      iVar2._M_current = *(void ***)(this_02 + 8);
      if (iVar2._M_current == *(void ***)(this_02 + 0x10)) {
        std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
                  (this_02,iVar2,ppvVar9);
      }
      else {
        *iVar2._M_current = *ppvVar9;
        *(long *)(this_02 + 8) = *(long *)(this_02 + 8) + 8;
      }
      ppvVar1 = (this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                .super__Vector_impl_data._M_start;
      ppvVar14 = (this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      ppvVar13 = ppvVar1 + lVar12 + 1;
      if (ppvVar13 != ppvVar14) {
        memmove(ppvVar1 + lVar12,ppvVar13,(long)ppvVar14 - (long)ppvVar13);
        ppvVar14 = (this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      }
      ppvVar14 = ppvVar14 + -1;
      (this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppvVar14;
      contextCount = contextCount + -1;
    } while (contextCount != 0);
  }
  return;
}

Assistant:

void MultiThreadedObjectTest::pullObjectsFromShared (TestThread& thread, int pbufferCount, int pixmapCount, int windowCount, int contextCount)
{
	de::Random&											rnd			= (thread.getId() == 0 ? m_rnd0 : m_rnd1);
	vector<EGLSurface>&									pbuffers	= (thread.getId() == 0 ? m_pbuffers0 : m_pbuffers1);
	vector<pair<eglu::NativeWindow*, EGLSurface> >&		windows		= (thread.getId() == 0 ? m_nativeWindows0 : m_nativeWindows1);
	vector<pair<eglu::NativePixmap*, EGLSurface> >&		pixmaps		= (thread.getId() == 0 ? m_nativePixmaps0 : m_nativePixmaps1);
	vector<EGLContext>&									contexts	= (thread.getId() == 0 ? m_contexts0 : m_contexts1);

	for (int pbufferNdx = 0; pbufferNdx < pbufferCount; pbufferNdx++)
	{
		const int ndx = rnd.getInt(0, (int)(m_sharedPbuffers.size()-1));

		pbuffers.push_back(m_sharedPbuffers[ndx]);
		m_sharedPbuffers.erase(m_sharedPbuffers.begin() + ndx);
	}

	for (int pixmapNdx = 0; pixmapNdx < pixmapCount; pixmapNdx++)
	{
		const int ndx = rnd.getInt(0, (int)(m_sharedNativePixmaps.size()-1));

		pixmaps.push_back(m_sharedNativePixmaps[ndx]);
		m_sharedNativePixmaps.erase(m_sharedNativePixmaps.begin() + ndx);
	}

	for (int windowNdx = 0; windowNdx < windowCount; windowNdx++)
	{
		const int ndx = rnd.getInt(0, (int)(m_sharedNativeWindows.size()-1));

		windows.push_back(m_sharedNativeWindows[ndx]);
		m_sharedNativeWindows.erase(m_sharedNativeWindows.begin() + ndx);
	}

	for (int contextNdx = 0; contextNdx < contextCount; contextNdx++)
	{
		const int ndx = rnd.getInt(0, (int)(m_sharedContexts.size()-1));

		contexts.push_back(m_sharedContexts[ndx]);
		m_sharedContexts.erase(m_sharedContexts.begin() + ndx);
	}
}